

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwGetInputMode(GLFWwindow *handle,int mode)

{
  int iVar1;
  
  if (handle != (GLFWwindow *)0x0) {
    if (_glfwInitialized == 0) {
      iVar1 = 0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else if (mode == 0x33003) {
      iVar1 = *(int *)(handle + 0x6c);
    }
    else if (mode == 0x33002) {
      iVar1 = *(int *)(handle + 0x68);
    }
    else if (mode == 0x33001) {
      iVar1 = *(int *)(handle + 0x70);
    }
    else {
      iVar1 = 0;
      _glfwInputError(0x10003,"Invalid input mode %i");
    }
    return iVar1;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/glfw/src/input.c"
                ,0x99,"int glfwGetInputMode(GLFWwindow *, int)");
}

Assistant:

GLFWAPI int glfwGetInputMode(GLFWwindow* handle, int mode)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (mode)
    {
        case GLFW_CURSOR:
            return window->cursorMode;
        case GLFW_STICKY_KEYS:
            return window->stickyKeys;
        case GLFW_STICKY_MOUSE_BUTTONS:
            return window->stickyMouseButtons;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode %i", mode);
            return 0;
    }
}